

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sensors.cpp
# Opt level: O2

bool __thiscall
iDynTree::SensorsList::setSerialization
          (SensorsList *this,SensorType *sensor_type,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *serializaton)

{
  pointer pvVar1;
  pointer pbVar2;
  ptrdiff_t sensor_index;
  Sensor *pSVar3;
  ostream *poVar4;
  size_type __n;
  long lVar5;
  ulong uVar6;
  bool bVar7;
  vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_> newVecSensors;
  allocator_type local_49;
  _Vector_base<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_> local_48;
  
  __n = (long)(serializaton->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish -
        (long)(serializaton->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start >> 5;
  pvVar1 = (this->pimpl->allSensors).
           super__Vector_base<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>,_std::allocator<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (__n == (long)*(pointer *)
                    ((long)&pvVar1[*sensor_type].
                            super__Vector_base<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>
                            ._M_impl + 8) -
             *(long *)&pvVar1[*sensor_type].
                       super__Vector_base<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>.
                       _M_impl >> 3) {
    std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>::vector
              ((vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_> *)&local_48,__n,
               &local_49);
    lVar5 = 0;
    uVar6 = 0;
    while( true ) {
      pbVar2 = (serializaton->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      bVar7 = (ulong)((long)(serializaton->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5) <=
              uVar6;
      if (bVar7) break;
      sensor_index = getSensorIndex(this,sensor_type,
                                    (string *)((long)&(pbVar2->_M_dataplus)._M_p + lVar5));
      if (sensor_index == -1) {
        poVar4 = std::operator<<((ostream *)&std::cerr,
                                 "[ERROR] SensorsTree::setSerialization error : sensor ");
        poVar4 = std::operator<<(poVar4,(string *)
                                        ((long)&(((serializaton->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                _M_dataplus)._M_p + lVar5));
        poVar4 = std::operator<<(poVar4," not found in sensor list.");
        std::endl<char,std::char_traits<char>>(poVar4);
        goto LAB_001bdccb;
      }
      pSVar3 = getSensor(this,sensor_type,sensor_index);
      local_48._M_impl.super__Vector_impl_data._M_start[uVar6] = pSVar3;
      uVar6 = uVar6 + 1;
      lVar5 = lVar5 + 0x20;
    }
    std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>::operator=
              ((this->pimpl->allSensors).
               super__Vector_base<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>,_std::allocator<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + *sensor_type,
               (vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_> *)&local_48);
LAB_001bdccb:
    std::_Vector_base<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>::~_Vector_base
              (&local_48);
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cerr,
                             "[ERROR] SensorsTree::setSerialization error : wrong size of serializaton vector"
                            );
    std::endl<char,std::char_traits<char>>(poVar4);
    bVar7 = false;
  }
  return bVar7;
}

Assistant:

bool SensorsList::setSerialization(const SensorType& sensor_type,
                                   const std::vector< std::string >& serializaton)
{
    if( serializaton.size() != this->getNrOfSensors(sensor_type) )
    {
         std::cerr << "[ERROR] SensorsTree::setSerialization error : wrong size of serializaton vector" << std::endl;
         return false;
    }

    std::vector<Sensor *> newVecSensors(serializaton.size());

    for(size_t i=0; i < serializaton.size(); i++ )
    {
        std::ptrdiff_t oldSensIndex = getSensorIndex(sensor_type,serializaton[i]);
        if( oldSensIndex == -1 )
        {
            std::cerr << "[ERROR] SensorsTree::setSerialization error : sensor " << serializaton[i] << " not found in sensor list." << std::endl;
            return false;
        }
        newVecSensors[i] = this->getSensor(sensor_type,oldSensIndex);
    }

    this->pimpl->allSensors[sensor_type] = newVecSensors;

    return true;
}